

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

BVHAggregate *
pbrt::BVHAggregate::Create
          (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *prims,
          ParameterDictionary *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  BVHAggregate *this;
  SplitMethod splitMethod;
  string ret;
  string splitMethodName;
  string local_a8;
  string local_88;
  string local_68;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_48;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"splitmethod","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sah","");
  ParameterDictionary::GetOneString(&local_88,parameters,&local_a8,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar2 == 0) {
      splitMethod = HLBVH;
      goto LAB_00429357;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar2 == 0) {
      splitMethod = Middle;
      goto LAB_00429357;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar2 == 0) {
      splitMethod = EqualCounts;
      goto LAB_00429357;
    }
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              (&local_a8,"BVH split method \"%s\" unknown.  Using \"sah\".",&local_88);
    Warning((FileLoc *)0x0,local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  splitMethod = SAH;
LAB_00429357:
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"maxnodeprims","");
  iVar2 = ParameterDictionary::GetOneInt(parameters,&local_a8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  this = (BVHAggregate *)operator_new(0x30);
  local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_start =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (prims->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BVHAggregate(this,&local_48,iVar2,splitMethod);
  if (local_48.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

BVHAggregate *BVHAggregate::Create(std::vector<PrimitiveHandle> prims,
                                   const ParameterDictionary &parameters) {
    std::string splitMethodName = parameters.GetOneString("splitmethod", "sah");
    BVHAggregate::SplitMethod splitMethod;
    if (splitMethodName == "sah")
        splitMethod = BVHAggregate::SplitMethod::SAH;
    else if (splitMethodName == "hlbvh")
        splitMethod = BVHAggregate::SplitMethod::HLBVH;
    else if (splitMethodName == "middle")
        splitMethod = BVHAggregate::SplitMethod::Middle;
    else if (splitMethodName == "equal")
        splitMethod = BVHAggregate::SplitMethod::EqualCounts;
    else {
        Warning(R"(BVH split method "%s" unknown.  Using "sah".)", splitMethodName);
        splitMethod = BVHAggregate::SplitMethod::SAH;
    }

    int maxPrimsInNode = parameters.GetOneInt("maxnodeprims", 4);
    return new BVHAggregate(std::move(prims), maxPrimsInNode, splitMethod);
}